

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_print.h
# Opt level: O3

void Color::print_info(string *out,bool important)

{
  ostream *poVar1;
  undefined7 in_register_00000031;
  Modifier reset;
  Modifier bold;
  Modifier green;
  Modifier local_24;
  Modifier local_20;
  Modifier local_1c;
  
  local_20.code = BOLD;
  local_24.code = RESET;
  local_1c.code = FG_GREEN;
  poVar1 = operator<<((ostream *)&std::cout,&local_1c);
  if ((int)CONCAT71(in_register_00000031,important) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"[------------] ",0xf);
    poVar1 = operator<<(poVar1,&local_24);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(out->_M_dataplus)._M_p,out->_M_string_length);
  }
  else {
    poVar1 = operator<<(poVar1,&local_20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"[------------] ",0xf);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(out->_M_dataplus)._M_p,out->_M_string_length);
    poVar1 = operator<<(poVar1,&local_24);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

inline void print_info(const std::string &out, bool important = false) {
  Color::Modifier green(Color::FG_GREEN);
  Color::Modifier bold(Color::BOLD);
  Color::Modifier reset(Color::RESET);
  if (!important) {
    std::cout << green << "[------------] " << reset << out << std::endl;
  } else {
    std::cout << green << bold << "[------------] " << out << reset << std::endl;
  }
}